

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::(anonymous_namespace)::NegativeGLSLCompileTime::Shader1_abi_cxx11_
          (string *__return_storage_ptr__,NegativeGLSLCompileTime *this,int binding)

{
  ostream *poVar1;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188;
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(&local_188,"\nlayout(binding = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)this);
  std::operator<<(poVar1,") buffer Buffer {\n  int x;\n};\nvoid main() {\n  x = 0;\n}");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

static std::string Shader1(int binding)
	{
		std::stringstream ss;
		ss << NL "layout(binding = " << binding
		   << ") buffer Buffer {" NL "  int x;" NL "};" NL "void main() {" NL "  x = 0;" NL "}";
		return ss.str();
	}